

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
tinyusdz::ascii::anon_unknown_3::ParseDouble
          (expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,string *s)

{
  fast_float *this;
  parse_options_t<char> in_R8;
  from_chars_result_t<char> fVar1;
  double result;
  value_type_conflict2 local_18;
  unexpected_type<const_char_*> local_10;
  
  this = (fast_float *)(s->_M_dataplus)._M_p;
  fVar1 = fast_float::from_chars_advanced<double,char>
                    (this,(char *)(this + s->_M_string_length),(char *)&local_18,
                     (double *)0x2e00000005,in_R8);
  if (fVar1.ec == 0) {
    (__return_storage_ptr__->contained).
    super_storage_t_impl<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = true;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value = local_18;
  }
  else {
    local_10.m_error = "Parse failed.";
    nonstd::expected_lite::
    expected<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,&local_10);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<double, std::string> ParseDouble(const std::string &s) {

  // Parse with fast_float
  double result;
  auto ans = fast_float::from_chars(s.data(), s.data() + s.size(), result);
  if (ans.ec != std::errc()) {
    // Current `fast_float` implementation does not report detailed parsing err.
    return nonstd::make_unexpected("Parse failed.");
  }

  return result;
}